

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Node<DomButtonGroup_const*,QString>::emplaceValue<QString_const&>
          (Node<const_DomButtonGroup_*,_QString> *this,QString *args)

{
  long lVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QString::QString(in_RDI,in_stack_ffffffffffffffb8);
  QString::operator=(in_RDI,in_stack_ffffffffffffffb8);
  QString::~QString((QString *)0x185ccb);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplaceValue(Args &&... args)
    {
        value = T(std::forward<Args>(args)...);
    }